

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ptls_iovec_t x9_62_encode_point(EC_GROUP *group,EC_POINT *point,BN_CTX *bn_ctx)

{
  size_t __size;
  uchar *buf;
  size_t sVar1;
  ptls_iovec_t pVar2;
  
  __size = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,POINT_CONVERSION_UNCOMPRESSED,
                              (uchar *)0x0,0,(BN_CTX *)bn_ctx);
  if (__size == 0) {
    buf = (uchar *)0x0;
    __size = 0;
  }
  else {
    buf = (uchar *)malloc(__size);
    if (buf != (uchar *)0x0) {
      sVar1 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,POINT_CONVERSION_UNCOMPRESSED,
                                 buf,__size,(BN_CTX *)bn_ctx);
      if (sVar1 == __size) goto LAB_0010bf93;
      free(buf);
    }
    buf = (uchar *)0x0;
    __size = 0;
  }
LAB_0010bf93:
  pVar2.len = __size;
  pVar2.base = buf;
  return pVar2;
}

Assistant:

static ptls_iovec_t x9_62_encode_point(const EC_GROUP *group, const EC_POINT *point, BN_CTX *bn_ctx)
{
    ptls_iovec_t vec;

    if ((vec.len = EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, bn_ctx)) == 0)
        return (ptls_iovec_t){NULL};
    if ((vec.base = malloc(vec.len)) == NULL)
        return (ptls_iovec_t){NULL};
    if (EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, vec.base, vec.len, bn_ctx) != vec.len) {
        free(vec.base);
        return (ptls_iovec_t){NULL};
    }

    return vec;
}